

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Console.cpp
# Opt level: O0

void __thiscall Console::Prompt::Private::getCursorPosition(Private *this,usize *x,usize *y)

{
  code *pcVar1;
  int iVar2;
  ssize_t sVar3;
  usize uVar4;
  int local_70;
  int local_6c;
  int iy;
  int ix;
  char buffer [64];
  usize *y_local;
  usize *x_local;
  Private *this_local;
  
  sVar3 = write(originalStdout,"\x1b[6n",4);
  if (sVar3 != 4) {
    iVar2 = Debug::printf("%s:%u: verification failed: %s\n",
                          "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]dehprox/3rdparty/libnstd/src/Console.cpp"
                          ,0x14f,"write(originalStdout, \"\\x1b[6n\", 4) == 4");
    if (iVar2 != 0) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
  }
  uVar4 = readNextUnbufferedEscapedSequence(this,(char *)&iy,'[','R');
  if (uVar4 < 2) {
    iVar2 = Debug::printf("%s:%u: verification failed: %s\n",
                          "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]dehprox/3rdparty/libnstd/src/Console.cpp"
                          ,0x151,"readNextUnbufferedEscapedSequence(buffer, \'[\', \'R\') > 1");
    if (iVar2 != 0) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
  }
  iVar2 = __isoc99_sscanf((long)&iy + 2,"%d;%d",&local_70,&local_6c);
  if (iVar2 != 2) {
    iVar2 = Debug::printf("%s:%u: verification failed: %s\n",
                          "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]dehprox/3rdparty/libnstd/src/Console.cpp"
                          ,0x153,"sscanf(buffer + 2, \"%d;%d\", &iy, &ix) == 2");
    if (iVar2 != 0) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
  }
  *x = (long)(local_6c + -1);
  *y = (long)(local_70 + -1);
  return;
}

Assistant:

void getCursorPosition(usize& x, usize& y)
  {
#ifdef _MSC_VER
    CONSOLE_SCREEN_BUFFER_INFO csbi;
    VERIFY(GetConsoleScreenBufferInfo(hOriginalStdOut, &csbi));
    x = csbi.dwCursorPosition.X;
    y = csbi.dwCursorPosition.Y;
#else
    VERIFY(write(originalStdout, "\x1b[6n", 4) == 4);
    char buffer[64];
    VERIFY(readNextUnbufferedEscapedSequence(buffer, '[', 'R') > 1);
    int ix, iy;
    VERIFY(sscanf(buffer + 2, "%d;%d", &iy, &ix) == 2);
    x = ix - 1;
    y = iy - 1;
#endif
  }